

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_misc_functions.cc
# Opt level: O2

unique_ptr<draco::CornerTable,_std::default_delete<draco::CornerTable>_> __thiscall
draco::CreateCornerTableFromAllAttributes(draco *this,Mesh *mesh)

{
  pointer paVar1;
  int j;
  long lVar2;
  FaceIndex i;
  ulong uVar3;
  long lVar4;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
  faces;
  FaceType new_face;
  
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::FaceIndex_tag_type_>,_std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>
  ::IndexTypeVector(&faces,((long)(mesh->faces_).vector_.
                                  super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(mesh->faces_).vector_.
                                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) / 0xc & 0xffffffff);
  new_face._M_elems[2].value_ = 0;
  new_face._M_elems[0].value_ = 0;
  new_face._M_elems[1].value_ = 0;
  lVar4 = 0;
  for (uVar3 = 0;
      paVar1 = (mesh->faces_).vector_.
               super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar3 < (((long)(mesh->faces_).vector_.
                      super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)paVar1) / 0xc & 0xffffffffU
              ); uVar3 = uVar3 + 1) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      new_face._M_elems[lVar2].value_ = *(uint *)((long)(paVar1->_M_elems + lVar2) + lVar4);
    }
    std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>::operator=
              (faces.vector_.
               super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
               ._M_impl.super__Vector_impl_data._M_start + uVar3,&new_face);
    lVar4 = lVar4 + 0xc;
  }
  CornerTable::Create((CornerTable *)this,&faces);
  std::
  _Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
  ::~_Vector_base((_Vector_base<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::VertexIndex_tag_type_>,_3UL>_>_>
                   *)&faces);
  return (__uniq_ptr_data<draco::CornerTable,_std::default_delete<draco::CornerTable>,_true,_true>)
         (__uniq_ptr_data<draco::CornerTable,_std::default_delete<draco::CornerTable>,_true,_true>)
         this;
}

Assistant:

std::unique_ptr<CornerTable> CreateCornerTableFromAllAttributes(
    const Mesh *mesh) {
  typedef CornerTable::FaceType FaceType;
  IndexTypeVector<FaceIndex, FaceType> faces(mesh->num_faces());
  FaceType new_face;
  for (FaceIndex i(0); i < mesh->num_faces(); ++i) {
    const Mesh::Face &face = mesh->face(i);
    // Each face is identified by point indices that automatically split the
    // mesh along attribute seams.
    for (int j = 0; j < 3; ++j) {
      new_face[j] = face[j].value();
    }
    faces[i] = new_face;
  }
  // Build the corner table.
  return CornerTable::Create(faces);
}